

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-cave.c
# Opt level: O0

void borg_init_cave(void)

{
  borg_grid *pbVar1;
  int local_c;
  int y;
  
  if ((z_info->dungeon_wid != 0xc6) || (z_info->dungeon_hgt != 0x42)) {
    borg_note("**STARTUP FAILURE** dungeon size miss match");
    borg_init_failure = true;
  }
  for (local_c = 0; local_c < 0x42; local_c = local_c + 1) {
    pbVar1 = (borg_grid *)mem_zalloc(0x948);
    borg_grids[local_c] = pbVar1;
  }
  return;
}

Assistant:

void borg_init_cave(void)
{
    /* sanity check  */
    if (DUNGEON_WID != z_info->dungeon_wid
        || DUNGEON_HGT != z_info->dungeon_hgt) {
        borg_note("**STARTUP FAILURE** dungeon size miss match");
        borg_init_failure = true;
    }

    /* Make each row of grids */
    for (int y = 0; y < AUTO_MAX_Y; y++) {
        /* Make each row */
        borg_grids[y] = mem_zalloc(AUTO_MAX_X * sizeof(borg_grid));
    }
}